

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined7 uVar5;
  undefined7 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  byte bVar6;
  pair<bool,_const_char_*> pVar7;
  
  uVar5 = (undefined7)(((ulong)lhs | (ulong)rhs) >> 8);
  if (((ulong)lhs | (ulong)rhs) != 0) {
    if (lhs == (char *)0x0) {
      uVar4 = CONCAT71(uVar5,1);
      lhs = rhs;
      goto LAB_002cb88d;
    }
    if (rhs != (char *)0x0) {
      if (t - NumberMinType < 2) {
        pVar7 = consistentNumberProperty(lhs,rhs,t);
        return pVar7;
      }
      if (t == StringType) {
        iVar3 = strcmp(lhs,rhs);
        uVar4 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),iVar3 == 0);
        if (iVar3 != 0) {
          lhs = (char *)0x0;
        }
      }
      else {
        if (t != BoolType) {
          __assert_fail("false && \"Unreachable!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                        ,0x11ba,
                        "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                       );
        }
        bVar1 = cmSystemTools::IsOn(lhs);
        bVar2 = cmSystemTools::IsOn(rhs);
        uVar4 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
        bVar6 = (byte)uVar4 ^ bVar1;
        uVar4 = CONCAT71((int7)(uVar4 >> 8),bVar6) ^ 1;
        if (bVar6 != 0) {
          lhs = (char *)0x0;
        }
      }
      goto LAB_002cb88d;
    }
  }
  uVar4 = CONCAT71(uVar5,1);
LAB_002cb88d:
  pVar7.second = lhs;
  pVar7._0_8_ = uVar4;
  return pVar7;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char* lhs,
                                                const char* rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs) {
    return std::make_pair(true, lhs);
  }
  if (!lhs) {
    return std::make_pair(true, rhs);
  }
  if (!rhs) {
    return std::make_pair(true, lhs);
  }

  const char* const null_ptr = nullptr;

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : nullptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType:
      return consistentNumberProperty(lhs, rhs, t);
  }
  assert(false && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}